

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdPrivkeyTweakAdd(void *handle,char *privkey,char *tweak,char **output)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  KeyApi api;
  Privkey key;
  string local_80;
  Privkey local_60;
  ByteData256 tweak_data;
  
  cfd::Initialize();
  if (output == (char **)0x0) {
    key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x60a;
    key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdPrivkeyTweakAdd";
    cfd::core::logger::warn<>((CfdSourceLocation *)&key,"output is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&key,"Failed to parameter. output is null.",(allocator *)&local_80);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&key);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(privkey);
  if (!bVar1) {
    bVar1 = cfd::capi::IsEmptyString(tweak);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&local_80,privkey,(allocator *)&local_60);
      cfd::api::KeyApi::GetPrivkey(&key,&api,&local_80,(NetType *)0x0,(bool *)0x0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::string((string *)&local_80,tweak,(allocator *)&local_60);
      cfd::core::ByteData256::ByteData256(&tweak_data,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      cfd::core::Privkey::CreateTweakAdd(&local_60,&key,&tweak_data);
      cfd::core::Privkey::GetHex_abi_cxx11_(&local_80,&local_60);
      pcVar2 = cfd::capi::CreateString(&local_80);
      *output = pcVar2;
      std::__cxx11::string::~string((string *)&local_80);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_data);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
      return 0;
    }
    key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x616;
    key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdPrivkeyTweakAdd";
    cfd::core::logger::warn<>((CfdSourceLocation *)&key,"tweak is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&key,"Failed to parameter. tweak is null or empty.",(allocator *)&local_80)
    ;
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&key);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
  key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x610;
  key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "CfdPrivkeyTweakAdd";
  cfd::core::logger::warn<>((CfdSourceLocation *)&key,"privkey is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&key,"Failed to parameter. privkey is null or empty.",(allocator *)&local_80)
  ;
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&key);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdPrivkeyTweakAdd(
    void* handle, const char* privkey, const char* tweak, char** output) {
  try {
    cfd::Initialize();
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }
    if (IsEmptyString(privkey)) {
      warn(CFD_LOG_SOURCE, "privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null or empty.");
    }
    if (IsEmptyString(tweak)) {
      warn(CFD_LOG_SOURCE, "tweak is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tweak is null or empty.");
    }

    KeyApi api;
    Privkey key = api.GetPrivkey(std::string(privkey), nullptr, nullptr);
    ByteData256 tweak_data(tweak);
    *output = CreateString(key.CreateTweakAdd(tweak_data).GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}